

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Visibility>_>::operator=
          (optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *this,
          optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *other)

{
  void *pvVar1;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      pvVar1 = *(void **)((long)&this->contained + 8);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,*(long *)((long)&this->contained + 0x18) - (long)pvVar1);
      }
      this->has_value_ = false;
    }
    else {
      *(undefined2 *)((long)&this->contained + 4) = *(undefined2 *)((long)&other->contained + 4);
      *(undefined4 *)&this->contained = *(undefined4 *)&other->contained;
      std::
      vector<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
      ::_M_move_assign((vector<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
                        *)((long)&this->contained + 8),(undefined1 *)((long)&other->contained + 8));
      *(undefined1 *)((long)&this->contained + 0x20) =
           *(undefined1 *)((long)&other->contained + 0x20);
    }
  }
  else if (other->has_value_ != false) {
    optional<tinyusdz::Animatable<tinyusdz::Visibility>>::
    initialize<tinyusdz::Animatable<tinyusdz::Visibility>>
              ((optional<tinyusdz::Animatable<tinyusdz::Visibility>> *)this,
               (Animatable<tinyusdz::Visibility> *)&other->contained);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }